

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void palette_rd_y(AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
                 int16_t *data,int16_t *centroids,int n,uint16_t *color_cache,int n_cache,
                 _Bool do_header_rd_based_gating,MB_MODE_INFO *best_mbmi,
                 uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,int *rate_tokenonly,
                 int64_t *distortion,uint8_t *skippable,int *beat_best_rd,PICK_MODE_CONTEXT *ctx,
                 uint8_t *blk_skip,uint8_t *tx_type_map,int *beat_best_palette_rd,
                 _Bool *do_header_rd_based_breakout,int discount_color_cost)

{
  byte bVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BLOCK_SIZE *pBVar6;
  AV1_COMP *cpi_00;
  long lVar7;
  BLOCK_SIZE in_CL;
  BLOCK_SIZE *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int16_t *in_stack_00000008;
  int in_stack_00000010;
  uint16_t *in_stack_00000018;
  int in_stack_00000020;
  undefined1 in_stack_00000028;
  void *in_stack_00000030;
  int txfm_search_done;
  int64_t this_rd;
  long *in_stack_00000040;
  int header_rd_shift;
  int64_t header_rd;
  int palette_mode_rate;
  int this_rate;
  RD_STATS tokenonly_rd_stats;
  int cols;
  int rows;
  int block_height;
  int block_width;
  uint8_t *color_map;
  MACROBLOCKD *xd;
  int i_1;
  int i;
  PALETTE_MODE_INFO *pmi;
  int num_unique_colors;
  undefined8 in_stack_ffffffffffffff18;
  int *cols_within_bounds;
  int16_t *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int16_t *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_94;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  BLOCK_SIZE in_stack_ffffffffffffff7f;
  RD_STATS *in_stack_ffffffffffffff80;
  MACROBLOCK *in_stack_ffffffffffffff88;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  MACROBLOCK *x_00;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  BLOCK_SIZE bsize_00;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar9;
  int multi_winner_mode_type;
  
  uVar9 = CONCAT13(in_stack_00000028,in_stack_ffffffffffffffcc) & 0x1ffffff;
  if (color_map != (uint8_t *)0x0) {
    *color_map = '\0';
  }
  optimize_palette_colors
            (in_stack_00000018,in_stack_00000020,in_stack_00000010,1,in_stack_00000008,
             *(int *)(*(long *)(in_RDI + 0x42008) + 0x48));
  iVar3 = remove_duplicates(in_stack_ffffffffffffff20,
                            (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  if (iVar3 < 2) {
    return;
  }
  pBVar6 = in_RDX + 0x5e;
  if (*(char *)(*(long *)(in_RDI + 0x42008) + 0x4c) == '\0') {
    for (in_stack_ffffffffffffffb8 = 0; multi_winner_mode_type = (int)in_R9,
        in_stack_ffffffffffffffb8 < iVar3; in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1
        ) {
      bVar1 = clip_pixel((int)in_stack_00000008[in_stack_ffffffffffffffb8]);
      *(ushort *)(pBVar6 + (long)in_stack_ffffffffffffffb8 * 2) = (ushort)bVar1;
    }
  }
  else {
    for (in_stack_ffffffffffffffbc = 0; multi_winner_mode_type = (int)in_R9,
        in_stack_ffffffffffffffbc < iVar3; in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1
        ) {
      uVar2 = clip_pixel_highbd((int)in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      *(undefined2 *)(pBVar6 + (long)in_stack_ffffffffffffffbc * 2) = uVar2;
    }
  }
  pBVar6[0x30] = (BLOCK_SIZE)iVar3;
  cpi_00 = (AV1_COMP *)(in_RSI + 0x1a0);
  x_00 = *(MACROBLOCK **)(in_RSI + 0x250);
  cols_within_bounds = (int *)&stack0xffffffffffffff98;
  av1_get_block_dimensions
            (in_CL,0,(MACROBLOCKD *)cpi_00,(int *)&stack0xffffffffffffffa4,
             (int *)&stack0xffffffffffffffa0,(int *)&stack0xffffffffffffff9c,cols_within_bounds);
  bsize_00 = (BLOCK_SIZE)pBVar6;
  av1_calc_indices(in_stack_ffffffffffffff30,
                   (int16_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (uint8_t *)in_stack_ffffffffffffff20,(int)((ulong)cols_within_bounds >> 0x20),
                   (int)cols_within_bounds,0);
  extend_palette_color_map
            ((uint8_t *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
             in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
             (int)in_stack_ffffffffffffff20);
  uVar2 = (undefined2)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  if ((uVar9 & 0x1000000) == 0) {
    av1_pick_uniform_tx_size_type_yrd
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (in_stack_ffffffffffffff70 == 0x7fffffff) {
      return;
    }
    iVar5 = in_stack_ffffffffffffff70;
    local_94 = intra_mode_info_cost_y
                         (cpi_00,x_00,
                          (MB_MODE_INFO *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (BLOCK_SIZE)((uint)in_stack_ffffffffffffff9c >> 0x18),
                          in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    local_94 = in_stack_ffffffffffffff70 + local_94;
  }
  else {
    local_94 = intra_mode_info_cost_y
                         (cpi_00,x_00,
                          (MB_MODE_INFO *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (BLOCK_SIZE)((uint)in_stack_ffffffffffffff9c >> 0x18),
                          in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    if (*in_stack_00000040 <
        ((long)local_94 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) >>
        (*(int *)(in_RDI + 0x60ba0) == 1)) {
      *color_map = '\x01';
      return;
    }
    av1_pick_uniform_tx_size_type_yrd
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (in_stack_ffffffffffffff70 == 0x7fffffff) {
      return;
    }
    local_94 = in_stack_ffffffffffffff70 + local_94;
    iVar5 = in_stack_ffffffffffffff70;
  }
  lVar7 = ((long)local_94 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78) * 0x80;
  if ((*(int *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x9b] +
               (ulong)((byte)*(undefined2 *)(in_RDX + 0xa7) & 7) * 2 + 2) == 0) &&
     (iVar4 = block_signals_txsize(*in_RDX), iVar4 != 0)) {
    iVar4 = tx_size_cost((MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                         ,(BLOCK_SIZE)((ushort)uVar2 >> 8),(TX_SIZE)uVar2);
    iVar5 = iVar5 - iVar4;
  }
  store_winner_mode_stats
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (RD_STATS *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (RD_STATS *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (THR_MODES)cpi_00,
             (uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),bsize_00,
             CONCAT44(uVar9,iVar3),multi_winner_mode_type,in_R8D);
  uVar8 = (undefined1)in_stack_ffffffffffffff90;
  if (lVar7 < *in_stack_00000040) {
    *in_stack_00000040 = lVar7;
    if (tokenonly_rd_stats.rdcost != 0) {
      *(undefined4 *)tokenonly_rd_stats.rdcost = 1;
    }
    memcpy((void *)this_rd,x_00,(long)(in_stack_ffffffffffffffa4 * in_stack_ffffffffffffffa0));
    memcpy(in_stack_00000030,in_RDX,0xb0);
    memcpy((void *)tokenonly_rd_stats._32_8_,(void *)(in_RSI + 0x24e09),
           (long)*(int *)(tokenonly_rd_stats.sse + 0x1a0));
    memcpy(_cols,*(void **)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xed] + 4),
           (long)*(int *)(tokenonly_rd_stats.sse + 0x1a0));
    if (header_rd != 0) {
      *(int *)header_rd = local_94;
    }
    if (_palette_mode_rate != (int *)0x0) {
      *_palette_mode_rate = iVar5;
    }
    if (tokenonly_rd_stats._0_8_ != 0) {
      *(ulong *)tokenonly_rd_stats._0_8_ =
           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78);
    }
    if (tokenonly_rd_stats.dist != 0) {
      *(undefined1 *)tokenonly_rd_stats.dist = uVar8;
    }
    if (_block_height != (undefined4 *)0x0) {
      *_block_height = 1;
    }
  }
  return;
}

Assistant:

static inline void palette_rd_y(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data, int16_t *centroids,
    int n, uint16_t *color_cache, int n_cache, bool do_header_rd_based_gating,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *blk_skip,
    uint8_t *tx_type_map, int *beat_best_palette_rd,
    bool *do_header_rd_based_breakout, int discount_color_cost) {
  if (do_header_rd_based_breakout != NULL) *do_header_rd_based_breakout = false;
  optimize_palette_colors(color_cache, n_cache, n, 1, centroids,
                          cpi->common.seq_params->bit_depth);
  const int num_unique_colors = remove_duplicates(centroids, n);
  if (num_unique_colors < PALETTE_MIN_SIZE) {
    // Too few unique colors to create a palette. And DC_PRED will work
    // well for that case anyway. So skip.
    return;
  }
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  if (cpi->common.seq_params->use_highbitdepth) {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel_highbd(
          (int)centroids[i], cpi->common.seq_params->bit_depth);
    }
  } else {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel(centroids[i]);
    }
  }
  pmi->palette_size[0] = num_unique_colors;
  MACROBLOCKD *const xd = &x->e_mbd;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  av1_calc_indices(data, centroids, color_map, rows * cols, num_unique_colors,
                   1);
  extend_palette_color_map(color_map, cols, rows, block_width, block_height);

  RD_STATS tokenonly_rd_stats;
  int this_rate;

  if (do_header_rd_based_gating) {
    assert(do_header_rd_based_breakout != NULL);
    const int palette_mode_rate = intra_mode_info_cost_y(
        cpi, x, mbmi, bsize, dc_mode_cost, discount_color_cost);
    const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
    // Less aggressive pruning when prune_luma_palette_size_search_level == 1.
    const int header_rd_shift =
        (cpi->sf.intra_sf.prune_luma_palette_size_search_level == 1) ? 1 : 0;
    // Terminate further palette_size search, if the header cost corresponding
    // to lower palette_size is more than *best_rd << header_rd_shift. This
    // logic is implemented with a right shift in the LHS to prevent a possible
    // overflow with the left shift in RHS.
    if ((header_rd >> header_rd_shift) > *best_rd) {
      *do_header_rd_based_breakout = true;
      return;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_y(cpi, x, mbmi, bsize, dc_mode_cost,
                                       discount_color_cost);
  }

  int64_t this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
    tokenonly_rd_stats.rate -= tx_size_cost(x, bsize, mbmi->tx_size);
  }
  // Collect mode stats for multiwinner mode processing
  const int txfm_search_done = 1;
  store_winner_mode_stats(
      &cpi->common, x, mbmi, NULL, NULL, NULL, THR_DC, color_map, bsize,
      this_rd, cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
  if (this_rd < *best_rd) {
    *best_rd = this_rd;
    // Setting beat_best_rd flag because current mode rd is better than best_rd.
    // This flag need to be updated only for palette evaluation in key frames
    if (beat_best_rd) *beat_best_rd = 1;
    memcpy(best_palette_color_map, color_map,
           block_width * block_height * sizeof(color_map[0]));
    *best_mbmi = *mbmi;
    memcpy(blk_skip, x->txfm_search_info.blk_skip,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    av1_copy_array(tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    if (rate) *rate = this_rate;
    if (rate_tokenonly) *rate_tokenonly = tokenonly_rd_stats.rate;
    if (distortion) *distortion = tokenonly_rd_stats.dist;
    if (skippable) *skippable = tokenonly_rd_stats.skip_txfm;
    if (beat_best_palette_rd) *beat_best_palette_rd = 1;
  }
}